

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_blake2sp_ref.c
# Opt level: O0

int blake2sp_init_key(blake2sp_state *S,size_t outlen,void *key,size_t keylen)

{
  int iVar1;
  undefined1 local_78 [8];
  uint8_t block [64];
  size_t i;
  size_t keylen_local;
  void *key_local;
  size_t outlen_local;
  blake2sp_state *S_local;
  
  if ((outlen == 0) || (0x20 < outlen)) {
    S_local._4_4_ = -1;
  }
  else if (((key == (void *)0x0) || (keylen == 0)) || (0x20 < keylen)) {
    S_local._4_4_ = -1;
  }
  else {
    memset(S->buf,0,0x200);
    S->buflen = 0;
    S->outlen = outlen;
    iVar1 = blake2sp_init_root(S->R,outlen,keylen);
    if (iVar1 < 0) {
      S_local._4_4_ = -1;
    }
    else {
      block[0x38] = '\0';
      block[0x39] = '\0';
      block[0x3a] = '\0';
      block[0x3b] = '\0';
      block[0x3c] = '\0';
      block[0x3d] = '\0';
      block[0x3e] = '\0';
      block[0x3f] = '\0';
      for (; (ulong)block._56_8_ < 8; block._56_8_ = block._56_8_ + 1) {
        iVar1 = blake2sp_init_leaf(S->S[block._56_8_],outlen,keylen,(uint32_t)block._56_8_);
        if (iVar1 < 0) {
          return -1;
        }
      }
      S->R[0].last_node = '\x01';
      S->S[7][0].last_node = '\x01';
      memset(local_78,0,0x40);
      memcpy(local_78,key,keylen);
      block[0x38] = '\0';
      block[0x39] = '\0';
      block[0x3a] = '\0';
      block[0x3b] = '\0';
      block[0x3c] = '\0';
      block[0x3d] = '\0';
      block[0x3e] = '\0';
      block[0x3f] = '\0';
      for (; (ulong)block._56_8_ < 8; block._56_8_ = block._56_8_ + 1) {
        blake2s_update(S->S[block._56_8_],local_78,0x40);
      }
      secure_zero_memory(local_78,0x40);
      S_local._4_4_ = 0;
    }
  }
  return S_local._4_4_;
}

Assistant:

int blake2sp_init_key( blake2sp_state *S, size_t outlen, const void *key, size_t keylen )
{
  size_t i;

  if( !outlen || outlen > BLAKE2S_OUTBYTES ) return -1;

  if( !key || !keylen || keylen > BLAKE2S_KEYBYTES ) return -1;

  memset( S->buf, 0, sizeof( S->buf ) );
  S->buflen = 0;
  S->outlen = outlen;

  if( blake2sp_init_root( S->R, outlen, keylen ) < 0 )
    return -1;

  for( i = 0; i < PARALLELISM_DEGREE; ++i )
    if( blake2sp_init_leaf( S->S[i], outlen, keylen, (uint32_t)i ) < 0 ) return -1;

  S->R->last_node = 1;
  S->S[PARALLELISM_DEGREE - 1]->last_node = 1;
  {
    uint8_t block[BLAKE2S_BLOCKBYTES];
    memset( block, 0, BLAKE2S_BLOCKBYTES );
    memcpy( block, key, keylen );

    for( i = 0; i < PARALLELISM_DEGREE; ++i )
      blake2s_update( S->S[i], block, BLAKE2S_BLOCKBYTES );

    secure_zero_memory( block, BLAKE2S_BLOCKBYTES ); /* Burn the key from stack */
  }
  return 0;
}